

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineOutputFile::setFrameBuffer
          (DeepScanLineOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  PixelType PVar1;
  int iVar2;
  size_t xst;
  size_t yst;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  Slice *pSVar6;
  ArgExc *pAVar7;
  const_iterator name;
  Channel *pCVar8;
  OutSliceInfo *pOVar9;
  DeepSlice *pDVar10;
  size_type sVar11;
  reference ppOVar12;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  size_t i_2;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  slices;
  Slice *sampleCountSlice;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  Lock lock;
  int in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  int in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  Lock *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  Channel *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffb20;
  DeepFrameBuffer *in_stack_fffffffffffffb28;
  ulong local_3c0;
  stringstream local_368 [16];
  ostream local_358 [376];
  stringstream local_1e0 [16];
  ostream local_1d0 [376];
  const_iterator local_58;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  ChannelList *local_28;
  DeepFrameBuffer *local_10;
  
  local_10 = in_RSI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffa30,
             (Mutex *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
             SUB41((uint)in_stack_fffffffffffffa24 >> 0x18,0));
  local_28 = Header::channels((Header *)0x1e23a5);
  local_40._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  do {
    local_48._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    if (!bVar3) {
      pSVar6 = DeepFrameBuffer::getSampleCountSlice(local_10);
      if (pSVar6->base != (char *)0x0) {
        *(char **)(*(long *)(in_RDI + 8) + 0x148) = pSVar6->base;
        *(int *)(*(long *)(in_RDI + 8) + 0x150) = (int)pSVar6->xStride;
        *(int *)(*(long *)(in_RDI + 8) + 0x154) = (int)pSVar6->yStride;
        std::
        vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
        ::vector((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                  *)0x1e2966);
        name._M_node = (_Base_ptr)
                       ChannelList::begin((ChannelList *)
                                          CONCAT44(in_stack_fffffffffffffa1c,
                                                   in_stack_fffffffffffffa18));
        while( true ) {
          ChannelList::end((ChannelList *)
                           CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
          bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
          ;
          if (!bVar3) break;
          ChannelList::ConstIterator::name((ConstIterator *)0x1e29ff);
          DeepFrameBuffer::find(in_stack_fffffffffffffb28,(char *)name._M_node);
          DeepFrameBuffer::end
                    ((DeepFrameBuffer *)
                     CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
          bVar3 = Imf_2_5::operator==((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
          ;
          if (bVar3) {
            pOVar9 = (OutSliceInfo *)operator_new(0x38);
            pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x1e2aae);
            PVar1 = pCVar8->type;
            pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x1e2ad6);
            in_stack_fffffffffffffa18 = pCVar8->xSampling;
            in_stack_fffffffffffffac0 =
                 ChannelList::ConstIterator::channel((ConstIterator *)0x1e2aff);
            in_stack_fffffffffffffa20 = in_stack_fffffffffffffac0->ySampling;
            in_stack_fffffffffffffabc = in_stack_fffffffffffffa18;
            anon_unknown_6::OutSliceInfo::OutSliceInfo
                      (pOVar9,PVar1,(char *)0x0,0,0,0,in_stack_fffffffffffffa18,
                       in_stack_fffffffffffffa20,true);
            std::
            vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
            ::push_back((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                         *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        (value_type *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
            ;
          }
          else {
            pOVar9 = (OutSliceInfo *)operator_new(0x38);
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2bdf);
            PVar1 = (pDVar10->super_Slice).type;
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2c07);
            pcVar5 = (pDVar10->super_Slice).base;
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2c2f);
            iVar2 = *(int *)&(pDVar10->super_Slice).field_0x34;
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2c51);
            xst = (pDVar10->super_Slice).xStride;
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2c73);
            yst = (pDVar10->super_Slice).yStride;
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2c95);
            in_stack_fffffffffffffa18 = (pDVar10->super_Slice).xSampling;
            pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2cb5);
            in_stack_fffffffffffffa20 = (pDVar10->super_Slice).ySampling;
            anon_unknown_6::OutSliceInfo::OutSliceInfo
                      (pOVar9,PVar1,pcVar5,(long)iVar2,xst,yst,in_stack_fffffffffffffa18,
                       in_stack_fffffffffffffa20,false);
            std::
            vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
            ::push_back((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                         *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        (value_type *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
            ;
          }
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20))
          ;
        }
        DeepFrameBuffer::operator=
                  ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
        ;
        for (local_3c0 = 0;
            sVar11 = std::
                     vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                     ::size((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                             *)(*(long *)(in_RDI + 8) + 0x108)), local_3c0 < sVar11;
            local_3c0 = local_3c0 + 1) {
          ppOVar12 = std::
                     vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                     ::operator[]((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                                   *)(*(long *)(in_RDI + 8) + 0x108),local_3c0);
          if (*ppOVar12 != (value_type)0x0) {
            operator_delete(*ppOVar12,0x38);
          }
        }
        std::
        vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
        ::operator=((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                     *)in_stack_fffffffffffffac0,
                    (vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                     *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        std::
        vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
        ::~vector((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                   *)in_stack_fffffffffffffa30);
        IlmThread_2_5::Lock::~Lock
                  ((Lock *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        return;
      }
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar7,"Invalid base pointer, please set a proper sample count slice.");
      __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    ChannelList::ConstIterator::name((ConstIterator *)0x1e2458);
    local_50._M_node =
         (_Base_ptr)DeepFrameBuffer::find(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    local_58._M_node =
         (_Base_ptr)
         DeepFrameBuffer::end
                   ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                   );
    bVar3 = Imf_2_5::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    if (!bVar3) {
      pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x1e250e);
      PVar1 = pCVar8->type;
      pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e2536);
      if (PVar1 != (pDVar10->super_Slice).type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1e0);
        poVar4 = std::operator<<(local_1d0,"Pixel type of \"");
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0x1e259a);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of output file \"");
        pcVar5 = fileName((DeepScanLineOutputFile *)0x1e25ee);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_1e0);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x1e26a2);
      iVar2 = pCVar8->xSampling;
      pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e26cb);
      if (iVar2 != (pDVar10->super_Slice).xSampling) {
LAB_001e2741:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_368);
        poVar4 = std::operator<<(local_358,"X and/or y subsampling factors of \"");
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0x1e2784);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of output file \"");
        pcVar5 = fileName((DeepScanLineOutputFile *)0x1e27d8);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_368);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar8 = ChannelList::ConstIterator::channel((ConstIterator *)0x1e26f6);
      iVar2 = pCVar8->ySampling;
      pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1e271f);
      if (iVar2 != (pDVar10->super_Slice).ySampling) goto LAB_001e2741;
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  } while( true );
}

Assistant:

void
DeepScanLineOutputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
            continue;

        if (i.channel().type != j.slice().type)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
                                "of output file \"" << fileName() << "\" is "
                                "not compatible with the frame buffer's "
                                "pixel type.");
        }

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
        {
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of output file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
        }
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    // (TODO) Support for different sampling rates?
    //

    vector<OutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new OutSliceInfo (i.channel().type,
                                                NULL,// base
                                                0,// sampleStride,
                                                0,// xStride
                                                0,// yStride
                                                i.channel().xSampling,
                                                i.channel().ySampling,
                                                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new OutSliceInfo (j.slice().type,
                                                j.slice().base,                      
                                                j.slice().sampleStride,
                                                j.slice().xStride,
                                                j.slice().yStride,
                                                j.slice().xSampling,
                                                j.slice().ySampling,
                                                false)); // zero

        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}